

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustr_titlecase_brkiter.cpp
# Opt level: O0

void __thiscall
icu_63::WholeStringBreakIterator::setText
          (WholeStringBreakIterator *this,UText *text,UErrorCode *errorCode)

{
  UBool UVar1;
  int64_t iVar2;
  int64_t length64;
  UErrorCode *errorCode_local;
  UText *text_local;
  WholeStringBreakIterator *this_local;
  
  UVar1 = ::U_SUCCESS(*errorCode);
  if (UVar1 != '\0') {
    iVar2 = utext_nativeLength_63(text);
    if (iVar2 < 0x80000000) {
      *(int *)&(this->super_BreakIterator).field_0x144 = (int)iVar2;
    }
    else {
      *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
    }
  }
  return;
}

Assistant:

void  WholeStringBreakIterator::setText(UText *text, UErrorCode &errorCode) {
    if (U_SUCCESS(errorCode)) {
        int64_t length64 = utext_nativeLength(text);
        if (length64 <= INT32_MAX) {
            length = (int32_t)length64;
        } else {
            errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
        }
    }
}